

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_set_negotiated_protocol(ptls_t *tls,char *protocol,size_t protocol_len)

{
  char *pcVar1;
  
  if (protocol == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    if (protocol_len == 0) {
      protocol_len = strlen(protocol);
    }
    pcVar1 = duplicate_as_str(protocol,protocol_len);
    if (pcVar1 == (char *)0x0) {
      return 0x201;
    }
  }
  free(tls->negotiated_protocol);
  tls->negotiated_protocol = pcVar1;
  return 0;
}

Assistant:

int ptls_set_negotiated_protocol(ptls_t *tls, const char *protocol, size_t protocol_len)
{
    char *duped = NULL;

    if (protocol != NULL && (duped = duplicate_as_str(protocol, protocol_len != 0 ? protocol_len : strlen(protocol))) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    free(tls->negotiated_protocol);
    tls->negotiated_protocol = duped;

    return 0;
}